

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptance_tests.cpp
# Opt level: O0

void (anonymous_namespace)::
     doUntil<(anonymous_namespace)::readUntil(std::istream&,std::__cxx11::string_const&)::__0>
               (istream *reader,string *delim,anon_class_8_1_6971b95b *f)

{
  bool bVar1;
  istream *piVar2;
  bool local_5a;
  undefined1 local_40 [8];
  string line;
  anon_class_8_1_6971b95b *f_local;
  string *delim_local;
  istream *reader_local;
  
  line.field_2._8_8_ = f;
  std::__cxx11::string::string((string *)local_40);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (reader,(string *)local_40);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    local_5a = false;
    if (bVar1) {
      local_5a = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_40,delim);
    }
    if (local_5a == false) break;
    readUntil(std::istream&,std::__cxx11::string_const&)::$_0::operator()
              ((__0 *)line.field_2._8_8_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void doUntil(std::istream &reader, const std::string &delim, F &&f) {
  std::string line;
  while (std::getline(reader, line) && line != delim)
    f(line);
}